

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::IsMatch
          (MessageDifferencer *this,FieldDescriptor *repeated_field,MapKeyComparator *key_comparator
          ,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields,Reporter *reporter,int index1,int index2)

{
  Reporter *pRVar1;
  string *psVar2;
  bool bVar3;
  CppType CVar4;
  int iVar5;
  Reflection *this_00;
  Reflection *this_01;
  Message *pMVar6;
  undefined1 local_100 [8];
  SpecificField specific_field;
  Message *m2;
  Message *m1;
  Reflection *reflection2;
  Reflection *reflection1;
  bool match;
  string *output_string;
  Reporter *backup_reporter;
  undefined1 local_58 [8];
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MapKeyComparator *key_comparator_local;
  FieldDescriptor *repeated_field_local;
  MessageDifferencer *this_local;
  
  current_parent_fields.
  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = unpacked_any;
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            *)local_58,parent_fields);
  CVar4 = FieldDescriptor::cpp_type(repeated_field);
  if (CVar4 == CPPTYPE_MESSAGE) {
    pRVar1 = this->reporter_;
    psVar2 = this->output_string_;
    this->reporter_ = reporter;
    this->output_string_ = (string *)0x0;
    if (key_comparator == (MapKeyComparator *)0x0) {
      reflection1._7_1_ =
           CompareFieldValueUsingParentFields
                     (this,message1,message2,
                      current_parent_fields.
                      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,repeated_field,index1
                      ,index2,(vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                               *)local_58);
    }
    else {
      this_00 = Message::GetReflection(message1);
      this_01 = Message::GetReflection(message2);
      pMVar6 = Reflection::GetRepeatedMessage(this_00,message1,repeated_field,index1);
      specific_field._88_8_ = Reflection::GetRepeatedMessage(this_01,message2,repeated_field,index2)
      ;
      SpecificField::SpecificField((SpecificField *)local_100);
      specific_field.message2._0_4_ =
           current_parent_fields.
           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      local_100 = (undefined1  [8])message1;
      specific_field.message1 = message2;
      specific_field._16_8_ = repeated_field;
      bVar3 = FieldDescriptor::is_map(repeated_field);
      if (bVar3) {
        specific_field.map_entry1 = (Message *)specific_field._88_8_;
        specific_field._40_8_ = pMVar6;
      }
      specific_field.unknown_field_number = index1;
      specific_field.unknown_field_type = index2;
      std::
      vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ::push_back((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   *)local_58,(value_type *)local_100);
      iVar5 = (*key_comparator->_vptr_MapKeyComparator[2])
                        (key_comparator,pMVar6,specific_field._88_8_,0,local_58);
      reflection1._7_1_ = (bool)((byte)iVar5 & 1);
    }
    this->reporter_ = pRVar1;
    this->output_string_ = psVar2;
    this_local._7_1_ = reflection1._7_1_;
  }
  else {
    this_local._7_1_ =
         CompareFieldValueUsingParentFields
                   (this,message1,message2,
                    current_parent_fields.
                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,repeated_field,index1,
                    index2,(vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                            *)local_58);
  }
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::~vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
             *)local_58);
  return this_local._7_1_;
}

Assistant:

bool MessageDifferencer::IsMatch(
    const FieldDescriptor* repeated_field,
    const MapKeyComparator* key_comparator, const Message* message1,
    const Message* message2, int unpacked_any,
    const std::vector<SpecificField>& parent_fields, Reporter* reporter,
    int index1, int index2) {
  std::vector<SpecificField> current_parent_fields(parent_fields);
  if (repeated_field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    return CompareFieldValueUsingParentFields(
        *message1, *message2, unpacked_any, repeated_field, index1, index2,
        &current_parent_fields);
  }
  // Back up the Reporter and output_string_.  They will be reset in the
  // following code.
  Reporter* backup_reporter = reporter_;
  std::string* output_string = output_string_;
  reporter_ = reporter;
  output_string_ = nullptr;
  bool match;

  if (key_comparator == nullptr) {
    match = CompareFieldValueUsingParentFields(
        *message1, *message2, unpacked_any, repeated_field, index1, index2,
        &current_parent_fields);
  } else {
    const Reflection* reflection1 = message1->GetReflection();
    const Reflection* reflection2 = message2->GetReflection();
    const Message& m1 =
        reflection1->GetRepeatedMessage(*message1, repeated_field, index1);
    const Message& m2 =
        reflection2->GetRepeatedMessage(*message2, repeated_field, index2);
    SpecificField specific_field;
    specific_field.message1 = message1;
    specific_field.message2 = message2;
    specific_field.unpacked_any = unpacked_any;
    specific_field.field = repeated_field;
    if (repeated_field->is_map()) {
      specific_field.map_entry1 = &m1;
      specific_field.map_entry2 = &m2;
    }
    specific_field.index = index1;
    specific_field.new_index = index2;
    current_parent_fields.push_back(specific_field);
    match = key_comparator->IsMatch(m1, m2, false, current_parent_fields);
  }

  reporter_ = backup_reporter;
  output_string_ = output_string;
  return match;
}